

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O3

void __thiscall
SPTest_ConstantExprInExpectation_Test::TestBody(SPTest_ConstantExprInExpectation_Test *this)

{
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
  *this_00;
  bool bVar1;
  Impl *pIVar2;
  Impl *pIVar3;
  ExprBase expr;
  char *message;
  AssertionResult gtest_ar;
  TestBasicProblem p;
  SPAdapter sp;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_630;
  AssertHelper local_628;
  internal local_620 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  undefined1 local_610 [16];
  pointer local_600;
  undefined **local_5d8;
  pointer local_2b8;
  pointer local_2a8;
  pointer local_2a0;
  pointer local_290;
  pointer local_288;
  pointer local_278;
  SPAdapter local_260;
  
  TestBasicProblem::TestBasicProblem((TestBasicProblem *)local_610,1,0);
  this_00 = (vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
             *)(local_610 + 8);
  local_260.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_260);
  pIVar2 = (Impl *)operator_new__(0x80);
  pIVar2->kind_ = FIRST_EXPR;
  local_600[-1] = pIVar2;
  *(undefined8 *)(pIVar2 + 2) = 0x4018000000000000;
  local_260.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_260);
  pIVar3 = (Impl *)operator_new__(0x80);
  pIVar3->kind_ = FIRST_EXPR;
  local_600[-1] = pIVar3;
  *(undefined8 *)(pIVar3 + 2) = 0x401c000000000000;
  local_260.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_260);
  expr.impl_ = (Impl *)operator_new__(0xc0);
  (expr.impl_)->kind_ = MUL;
  ((ExprBase *)(local_600 + -1))->impl_ = expr.impl_;
  *(Impl **)(expr.impl_ + 2) = pIVar2;
  *(Impl **)(expr.impl_ + 4) = pIVar3;
  TestProblem::AddExpectationObj((TestProblem *)local_610,(Expr)expr.impl_);
  mp::SPAdapter::SPAdapter(&local_260,(ColProblem *)local_610);
  pIVar2 = ((local_260.nonlinear_objs_.
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_;
  pIVar3 = (Impl *)0x0;
  if (pIVar2->kind_ == FIRST_EXPR) {
    pIVar3 = pIVar2;
  }
  local_628.data_._0_4_ = 0x2a;
  local_630.ptr_ =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)(pIVar3 + 2);
  testing::internal::CmpHelperEQ<int,double>
            (local_620,"42","constant.value()",(int *)&local_628,(double *)&local_630);
  if (local_620[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_630);
    if (local_618.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_618.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x164,
               message);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if (local_630.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_630.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_630.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::SPAdapter::~SPAdapter(&local_260);
  local_610._0_8_ = &PTR__ColProblem_00198718;
  local_5d8 = &PTR__ColProblem_00198738;
  if (local_288 != (pointer)0x0) {
    operator_delete(local_288,(long)local_278 - (long)local_288);
  }
  if (local_2a0 != (pointer)0x0) {
    operator_delete(local_2a0,(long)local_290 - (long)local_2a0);
  }
  if (local_2b8 != (pointer)0x0) {
    operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)local_610);
  return;
}

Assistant:

TEST(SPTest, ConstantExprInExpectation) {
  TestBasicProblem p(1);
  p.AddExpectationObj(
        p.MakeBinary(expr::MUL, p.MakeNumericConstant(6),
                     p.MakeNumericConstant(7)));
  mp::SPAdapter sp(p);
  auto constant = mp::Cast<mp::NumericConstant>(sp.obj(0).nonlinear_expr());
  EXPECT_EQ(42, constant.value());
}